

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_examples_one_binding
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  key_type *pkVar1;
  size_type *psVar2;
  pointer pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _func_int **pp_Var5;
  ShaderProgram *pSVar6;
  pointer pcVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  LayoutBindingTestResult *pLVar11;
  char cVar12;
  int iVar13;
  ostream *poVar14;
  undefined4 extraout_var;
  mapped_type_conflict *pmVar16;
  undefined4 extraout_var_00;
  long *plVar17;
  undefined8 *puVar18;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 uVar19;
  undefined4 extraout_var_04;
  ulong uVar20;
  pointer pbVar21;
  ulong uVar22;
  char *pcVar23;
  StringIntMap offsets;
  StringVector list;
  StringVector list_1;
  IntVector expected;
  StringStream s;
  undefined1 local_328 [48];
  String local_2f8;
  LayoutBindingProgram *local_2d8;
  LayoutBindingTestResult *local_2d0;
  undefined1 local_2c8 [24];
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  IProgramContextSupplier *local_2a8;
  code *local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  String local_278;
  vector<int,_std::allocator<int>_> local_258;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  pointer *local_1f8;
  long local_1f0;
  pointer local_1e8 [2];
  undefined1 local_1d8 [112];
  undefined **local_168 [27];
  undefined8 local_90;
  undefined2 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  LayoutBindingProgram *pLVar15;
  
  std::ios_base::ios_base((ios_base *)local_168);
  local_2a0 = glUniformMatrix3x2fv;
  local_168[0] = (undefined **)glUniformMatrix3x2fv;
  local_90 = 0;
  local_88 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  local_1d8._0_8_ = &PTR__StringStream_020f2a68;
  local_168[0] = &PTR__StringStream_020f2a90;
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_2f8,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1b])(local_328,this,&local_2f8);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
  pcVar23 = local_328 + 0x10;
  if ((char *)local_328._0_8_ != pcVar23) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) !=
      &local_2f8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                    local_2f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_ACCESS",(String *)local_328);
  if ((char *)local_328._0_8_ != pcVar23) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  StringStream::reset((StringStream *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,"layout(binding=0, offset=4) uniform atomic_uint;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,"layout(binding=0) uniform atomic_uint ",0x26);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_328,this,0);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
  if ((char *)local_328._0_8_ != pcVar23) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_DECL",(String *)local_328);
  if ((char *)local_328._0_8_ != pcVar23) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  LayoutBindingBaseCase::updateTemplate
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type);
  local_2a8 = &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier;
  iVar13 = (*(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier.
             _vptr_IProgramContextSupplier[6])();
  pLVar15 = (LayoutBindingProgram *)CONCAT44(extraout_var,iVar13);
  iVar13 = (*pLVar15->_vptr_LayoutBindingProgram[2])(pLVar15);
  pSVar6 = pLVar15->m_program;
  if (iVar13 == 2) {
    if (((*pSVar6->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bd8b37;
LAB_00bd845b:
    if ((pSVar6->m_program).m_info.linkOk == false) goto LAB_00bd8b37;
    local_2c8._0_8_ = (key_type *)0x0;
    local_2c8._8_8_ = (pointer)0x0;
    local_2c8._16_8_ = (pointer)0x0;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c8);
    (*pLVar15->_vptr_LayoutBindingProgram[5])(local_328,pLVar15,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)local_328,(key_type *)local_2c8._0_8_);
    iVar13 = *pmVar16;
    if (iVar13 != 4) {
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"offset did not match requested","");
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)local_328,(key_type *)local_2c8._0_8_);
      LayoutBindingBaseCase::generateLog<int,int>
                (&local_2f8,&this->super_LayoutBindingBaseCase,&local_278,*pmVar16,1);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_reason,
                 CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                 local_2f8._M_string_length +
                 CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) !=
          &local_2f8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                        local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)local_328);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
    (*pLVar15->_vptr_LayoutBindingProgram[1])(pLVar15);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
    std::ios_base::~ios_base((ios_base *)local_168);
    if (iVar13 != 4) {
      return __return_storage_ptr__;
    }
    std::ios_base::ios_base((ios_base *)local_168);
    local_168[0] = (undefined **)local_2a0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0;
    uStack_68 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    local_1d8._0_8_ = &PTR__StringStream_020f2a68;
    local_168[0] = &PTR__StringStream_020f2a90;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_2f8,this,0);
    pcVar23 = local_328 + 0x10;
    paVar4 = &local_2f8.field_2;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) != paVar4) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                      local_2f8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_2f8,this,1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) != paVar4) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                      local_2f8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_2f8,this,2);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) != paVar4) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                      local_2f8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_2f8,this,3);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) != paVar4) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                      local_2f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
               "UNIFORM_ACCESS",(String *)local_328);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    StringStream::reset((StringStream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(binding=0, offset=4) uniform atomic_uint ",0x30);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,0);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(binding=0) uniform atomic_uint ",0x26);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,1);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(binding=0) uniform atomic_uint ",0x26);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,2);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(binding=0) uniform atomic_uint ",0x26);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,3);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    std::__cxx11::stringbuf::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
               "UNIFORM_DECL",(String *)local_328);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    LayoutBindingBaseCase::updateTemplate
              (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type);
    iVar13 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
    pLVar15 = (LayoutBindingProgram *)CONCAT44(extraout_var_00,iVar13);
    iVar13 = (*pLVar15->_vptr_LayoutBindingProgram[2])(pLVar15);
    pSVar6 = pLVar15->m_program;
    if (iVar13 != 2) {
      if (((*pSVar6->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != false)
      goto LAB_00bd8bc8;
LAB_00bd8e15:
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_328,pLVar15,false);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_reason,local_328._0_8_,
                 (char *)(local_328._0_8_ + local_328._8_8_));
      if ((char *)local_328._0_8_ != pcVar23) {
        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
      }
      (*pLVar15->_vptr_LayoutBindingProgram[1])(pLVar15);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      goto LAB_00bd8b9d;
    }
    if (((*pSVar6->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bd8e15;
LAB_00bd8bc8:
    if ((pSVar6->m_program).m_info.linkOk == false) goto LAB_00bd8e15;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d8 = pLVar15;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,3);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,&local_298);
    (*pLVar15->_vptr_LayoutBindingProgram[5])(local_328,pLVar15,&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2f8._M_dataplus._M_p._0_4_ = 4;
    std::vector<int,_std::allocator<int>_>::_M_insert_rval
              (&local_258,(const_iterator)0x0,(value_type_conflict1 *)&local_2f8);
    local_2f8._M_dataplus._M_p._0_4_ = 8;
    std::vector<int,_std::allocator<int>_>::_M_insert_rval
              (&local_258,
               (const_iterator)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_2f8);
    local_2f8._M_dataplus._M_p._0_4_ = 0xc;
    std::vector<int,_std::allocator<int>_>::_M_insert_rval
              (&local_258,
               (const_iterator)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_2f8);
    local_2f8._M_dataplus._M_p._0_4_ = 0x10;
    std::vector<int,_std::allocator<int>_>::_M_insert_rval
              (&local_258,
               (const_iterator)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_2f8);
    bVar9 = true;
    pLVar15 = local_2d8;
    local_2d0 = __return_storage_ptr__;
    if (local_298.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_298.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar22 = 0;
      uVar20 = 1;
      do {
        iVar13 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar22];
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                *)local_328,
                               local_298.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar22);
        if (iVar13 != *pmVar16) {
          local_218 = local_208;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"offset of","");
          pcVar7 = local_298.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_dataplus._M_p;
          local_238 = local_228;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,pcVar7,
                     pcVar7 + local_298.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_string_length);
          __return_storage_ptr__ = local_2d0;
          uVar20 = 0xf;
          if (local_218 != local_208) {
            uVar20 = local_208[0];
          }
          if (uVar20 < (ulong)(local_230 + local_210)) {
            uVar20 = 0xf;
            if (local_238 != local_228) {
              uVar20 = local_228[0];
            }
            if (uVar20 < (ulong)(local_230 + local_210)) goto LAB_00bd8f35;
            plVar17 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_238,0,(char *)0x0,(ulong)local_218);
          }
          else {
LAB_00bd8f35:
            plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_238);
          }
          local_2c8._0_8_ = local_2c8 + 0x10;
          pkVar1 = (key_type *)(plVar17 + 2);
          if ((key_type *)*plVar17 == pkVar1) {
            local_2c8._16_8_ = (pkVar1->_M_dataplus)._M_p;
            uStack_2b0 = (undefined4)plVar17[3];
            uStack_2ac = *(undefined4 *)((long)plVar17 + 0x1c);
          }
          else {
            local_2c8._16_8_ = (pkVar1->_M_dataplus)._M_p;
            local_2c8._0_8_ = (key_type *)*plVar17;
          }
          local_2c8._8_8_ = plVar17[1];
          *plVar17 = (long)pkVar1;
          plVar17[1] = 0;
          *(undefined1 *)&(pkVar1->_M_dataplus)._M_p = 0;
          local_1f8 = local_1e8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,"did not match requested","");
          pbVar3 = (pointer)((long)&((_Alloc_hider *)local_2c8._8_8_)->_M_p + local_1f0);
          pbVar21 = (pointer)0xf;
          if ((key_type *)local_2c8._0_8_ != (key_type *)(local_2c8 + 0x10)) {
            pbVar21 = (pointer)local_2c8._16_8_;
          }
          if (pbVar21 < pbVar3) {
            pbVar21 = (pointer)0xf;
            if (local_1f8 != local_1e8) {
              pbVar21 = local_1e8[0];
            }
            if (pbVar21 < pbVar3) goto LAB_00bd9010;
            puVar18 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,local_2c8._0_8_)
            ;
          }
          else {
LAB_00bd9010:
            puVar18 = (undefined8 *)std::__cxx11::string::_M_append(local_2c8,(ulong)local_1f8);
          }
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          psVar2 = puVar18 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar2) {
            local_278.field_2._M_allocated_capacity = *psVar2;
            local_278.field_2._8_8_ = puVar18[3];
          }
          else {
            local_278.field_2._M_allocated_capacity = *psVar2;
            local_278._M_dataplus._M_p = (pointer)*puVar18;
          }
          local_278._M_string_length = puVar18[1];
          *puVar18 = psVar2;
          puVar18[1] = 0;
          *(undefined1 *)psVar2 = 0;
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)local_328,
                                 local_298.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar22);
          LayoutBindingBaseCase::generateLog<int,int>
                    (&local_2f8,&this->super_LayoutBindingBaseCase,&local_278,*pmVar16,
                     local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22]);
          __return_storage_ptr__->m_passed = false;
          __return_storage_ptr__->m_notRunForThisContext = false;
          (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_reason).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_reason,
                     CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                     local_2f8._M_string_length +
                     CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) !=
              &local_2f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_2f8._M_dataplus._M_p._4_4_,
                                     local_2f8._M_dataplus._M_p._0_4_),
                            local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if (local_1f8 != local_1e8) {
            operator_delete(local_1f8,(ulong)((long)&(local_1e8[0]->_M_dataplus)._M_p + 1));
          }
          if ((key_type *)local_2c8._0_8_ != (key_type *)(local_2c8 + 0x10)) {
            operator_delete((void *)local_2c8._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_2c8._16_8_)->_M_p + 1));
          }
          pLVar15 = local_2d8;
          if (local_238 != local_228) {
            operator_delete(local_238,local_228[0] + 1);
          }
          if (local_218 != local_208) {
            operator_delete(local_218,local_208[0] + 1);
          }
          bVar9 = false;
          goto LAB_00bd91a9;
        }
        bVar9 = uVar20 < (ulong)((long)local_298.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_298.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar22 = uVar20;
        uVar20 = (ulong)((int)uVar20 + 1);
      } while (bVar9);
      bVar9 = true;
      __return_storage_ptr__ = local_2d0;
      pLVar15 = local_2d8;
    }
LAB_00bd91a9:
    if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)local_328);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_298);
    (*pLVar15->_vptr_LayoutBindingProgram[1])(pLVar15);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
    std::ios_base::~ios_base((ios_base *)local_168);
    if (!bVar9) {
      return __return_storage_ptr__;
    }
    std::ios_base::ios_base((ios_base *)local_168);
    local_168[0] = (undefined **)local_2a0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0;
    uStack_68 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    local_1d8._0_8_ = &PTR__StringStream_020f2a68;
    local_168[0] = &PTR__StringStream_020f2a90;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_2f8,this,0);
    pcVar23 = local_328 + 0x10;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) !=
        &local_2f8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                      local_2f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
               "UNIFORM_ACCESS",(String *)local_328);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    StringStream::reset((StringStream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(binding=0, offset=4) uniform atomic_uint;\n",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(offset=8) uniform atomic_uint ",0x25);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_328,this,0);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    std::__cxx11::stringbuf::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
               "UNIFORM_DECL",(String *)local_328);
    if ((char *)local_328._0_8_ != pcVar23) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    LayoutBindingBaseCase::updateTemplate
              (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type);
    iVar13 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
    pLVar15 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar13);
    iVar13 = (*pLVar15->_vptr_LayoutBindingProgram[2])(pLVar15);
    pSVar6 = pLVar15->m_program;
    if (iVar13 != 2) {
      if (((*pSVar6->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != false)
      goto LAB_00bd9465;
LAB_00bd94bb:
      (*pLVar15->_vptr_LayoutBindingProgram[1])(pLVar15);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base((ios_base *)local_168);
      std::ios_base::ios_base((ios_base *)local_168);
      local_168[0] = (undefined **)local_2a0;
      local_90 = 0;
      local_88 = 0;
      local_80 = 0;
      uStack_78 = 0;
      local_70 = 0;
      uStack_68 = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      local_1d8._0_8_ = &PTR__StringStream_020f2a68;
      local_168[0] = &PTR__StringStream_020f2a90;
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_2f8,this,0);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
      pcVar23 = local_328 + 0x10;
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
      if ((char *)local_328._0_8_ != pcVar23) {
        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) !=
          &local_2f8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_),
                        local_2f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_ACCESS",(String *)local_328);
      if ((char *)local_328._0_8_ != pcVar23) {
        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
      }
      StringStream::reset((StringStream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(offset=4) uniform atomic_uint ",0x25);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_328,this,0);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
      if ((char *)local_328._0_8_ != pcVar23) {
        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_DECL",(String *)local_328);
      if ((char *)local_328._0_8_ != pcVar23) {
        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
      }
      LayoutBindingBaseCase::updateTemplate
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                );
      iVar13 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
      plVar17 = (long *)CONCAT44(extraout_var_02,iVar13);
      iVar13 = (**(code **)(*plVar17 + 0x10))(plVar17);
      lVar8 = plVar17[6];
      if (iVar13 == 2) {
        if (*(char *)(**(long **)(lVar8 + 0x78) + 0x58) != '\x01') goto LAB_00bd97ac;
      }
      else if (*(char *)(**(long **)(lVar8 + 0x18) + 0x58) == '\0') goto LAB_00bd97ac;
      if (*(char *)(lVar8 + 0xc0) != '\x01') {
LAB_00bd97ac:
        (**(code **)(*plVar17 + 8))(plVar17);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base((ios_base *)local_168);
        bVar9 = true;
        do {
          bVar10 = bVar9;
          pcVar23 = local_328 + 0x10;
          std::ios_base::ios_base((ios_base *)local_168);
          local_168[0] = (undefined **)local_2a0;
          local_90 = 0;
          local_88 = 0;
          local_70 = 0;
          uStack_68 = 0;
          local_80 = 0;
          uStack_78 = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
          local_1d8._0_8_ = &PTR__StringStream_020f2a68;
          local_168[0] = &PTR__StringStream_020f2a90;
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(&local_2f8,this,0);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
          if ((char *)local_328._0_8_ != pcVar23) {
            operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) !=
              &local_2f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_2f8._M_dataplus._M_p._4_4_,
                                     local_2f8._M_dataplus._M_p._0_4_),
                            local_2f8.field_2._M_allocated_capacity + 1);
          }
          if (!bVar10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(&local_2f8,this,1);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
            if ((char *)local_328._0_8_ != pcVar23) {
              operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) !=
                &local_2f8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_2f8._M_dataplus._M_p._4_4_,
                                       local_2f8._M_dataplus._M_p._0_4_),
                              local_2f8.field_2._M_allocated_capacity + 1);
            }
          }
          std::__cxx11::stringbuf::str();
          LayoutBindingBaseCase::setTemplateParam
                    (&this->super_LayoutBindingBaseCase,
                     (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                     (String *)local_328);
          if ((char *)local_328._0_8_ != pcVar23) {
            operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
          }
          StringStream::reset((StringStream *)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,"layout(binding=0, offset=0) uniform atomic_uint ",0x30);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(local_328,this,0);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
          if ((char *)local_328._0_8_ != pcVar23) {
            operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
          }
          if (!bVar10) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,"layout(binding=0, offset=0) uniform atomic_uint ",0x30)
            ;
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_328,this,1);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
            if ((char *)local_328._0_8_ != pcVar23) {
              operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
            }
          }
          std::__cxx11::stringbuf::str();
          LayoutBindingBaseCase::setTemplateParam
                    (&this->super_LayoutBindingBaseCase,
                     (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                     (String *)local_328);
          if ((char *)local_328._0_8_ != pcVar23) {
            operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
          }
          LayoutBindingBaseCase::updateTemplate
                    (&this->super_LayoutBindingBaseCase,
                     (this->super_LayoutBindingBaseCase).m_stage.type);
          iVar13 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
          pLVar15 = (LayoutBindingProgram *)CONCAT44(extraout_var_03,iVar13);
          iVar13 = (*pLVar15->_vptr_LayoutBindingProgram[2])(pLVar15);
          pSVar6 = pLVar15->m_program;
          if (iVar13 == 2) {
            if (((*pSVar6->m_shaders[5].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bd9b1b;
LAB_00bd9b2c:
            cVar12 = (pSVar6->m_program).m_info.linkOk;
          }
          else {
            if (((*pSVar6->m_shaders[1].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bd9b2c;
LAB_00bd9b1b:
            cVar12 = '\0';
          }
          if (bVar10) {
            if (cVar12 == '\0') {
              local_328._0_8_ = local_328 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_328,"should not compile","");
              __return_storage_ptr__ = local_2d0;
              local_2d0->m_passed = false;
              local_2d0->m_notRunForThisContext = false;
              (local_2d0->m_reason)._M_dataplus._M_p = (pointer)&(local_2d0->m_reason).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2d0->m_reason,local_328._0_8_,
                         (char *)(local_328._0_8_ + local_328._8_8_));
LAB_00bda02e:
              if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
                operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
              }
              (*pLVar15->_vptr_LayoutBindingProgram[1])(pLVar15);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
              goto LAB_00bd8b9d;
            }
          }
          else if (cVar12 != '\0') {
            LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_328,pLVar15,false);
            __return_storage_ptr__ = local_2d0;
            local_2d0->m_passed = true;
            local_2d0->m_notRunForThisContext = false;
            (local_2d0->m_reason)._M_dataplus._M_p = (pointer)&(local_2d0->m_reason).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d0->m_reason,local_328._0_8_,
                       (char *)(local_328._0_8_ + local_328._8_8_));
            goto LAB_00bda02e;
          }
          (*pLVar15->_vptr_LayoutBindingProgram[1])(pLVar15);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          uVar19 = std::ios_base::~ios_base((ios_base *)local_168);
          bVar9 = false;
        } while (bVar10);
        local_2d8 = (LayoutBindingProgram *)
                    CONCAT44(local_2d8._4_4_,(int)CONCAT71((int7)((ulong)uVar19 >> 8),1));
        do {
          pcVar23 = local_328 + 0x10;
          std::ios_base::ios_base((ios_base *)local_168);
          local_168[0] = (undefined **)local_2a0;
          local_90 = 0;
          local_88 = 0;
          local_70 = 0;
          uStack_68 = 0;
          local_80 = 0;
          uStack_78 = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
          local_1d8._0_8_ = &PTR__StringStream_020f2a68;
          local_168[0] = &PTR__StringStream_020f2a90;
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(&local_2f8,this,0);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
          if ((char *)local_328._0_8_ != pcVar23) {
            operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) !=
              &local_2f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_2f8._M_dataplus._M_p._4_4_,
                                     local_2f8._M_dataplus._M_p._0_4_),
                            local_2f8.field_2._M_allocated_capacity + 1);
          }
          if (((ulong)local_2d8 & 1) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(&local_2f8,this,1);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x1b])(local_328,this,&local_2f8);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
            if ((char *)local_328._0_8_ != pcVar23) {
              operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_2f8._M_dataplus._M_p._4_4_,local_2f8._M_dataplus._M_p._0_4_) !=
                &local_2f8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_2f8._M_dataplus._M_p._4_4_,
                                       local_2f8._M_dataplus._M_p._0_4_),
                              local_2f8.field_2._M_allocated_capacity + 1);
            }
          }
          std::__cxx11::stringbuf::str();
          LayoutBindingBaseCase::setTemplateParam
                    (&this->super_LayoutBindingBaseCase,
                     (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                     (String *)local_328);
          if ((char *)local_328._0_8_ != pcVar23) {
            operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
          }
          StringStream::reset((StringStream *)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,"layout(binding=0, offset=0) uniform atomic_uint ",0x30);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(local_328,this,0);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
          if ((char *)local_328._0_8_ != pcVar23) {
            operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
          }
          if (((ulong)local_2d8 & 1) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,"layout(binding=0, offset=2) uniform atomic_uint ",0x30)
            ;
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_328,this,1);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_328._0_8_,local_328._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
            if ((char *)local_328._0_8_ != pcVar23) {
              operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
            }
          }
          std::__cxx11::stringbuf::str();
          LayoutBindingBaseCase::setTemplateParam
                    (&this->super_LayoutBindingBaseCase,
                     (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                     (String *)local_328);
          if ((char *)local_328._0_8_ != pcVar23) {
            operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
          }
          LayoutBindingBaseCase::updateTemplate
                    (&this->super_LayoutBindingBaseCase,
                     (this->super_LayoutBindingBaseCase).m_stage.type);
          iVar13 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
          pLVar15 = (LayoutBindingProgram *)CONCAT44(extraout_var_04,iVar13);
          iVar13 = (*pLVar15->_vptr_LayoutBindingProgram[2])(pLVar15);
          pSVar6 = pLVar15->m_program;
          if (iVar13 == 2) {
            if (((*pSVar6->m_shaders[5].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bd9ed9;
LAB_00bd9eea:
            cVar12 = (pSVar6->m_program).m_info.linkOk;
          }
          else {
            if (((*pSVar6->m_shaders[1].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bd9eea;
LAB_00bd9ed9:
            cVar12 = '\0';
          }
          if (((ulong)local_2d8 & 1) == 0) {
            if (cVar12 != '\0') {
              LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_328,pLVar15,false);
              __return_storage_ptr__ = local_2d0;
              local_2d0->m_passed = true;
              local_2d0->m_notRunForThisContext = false;
              (local_2d0->m_reason)._M_dataplus._M_p = (pointer)&(local_2d0->m_reason).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2d0->m_reason,local_328._0_8_,
                         (char *)(local_328._0_8_ + local_328._8_8_));
              goto LAB_00bda0ff;
            }
          }
          else if (cVar12 == '\0') {
            local_328._0_8_ = local_328 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,"should not compile","");
            __return_storage_ptr__ = local_2d0;
            local_2d0->m_passed = false;
            local_2d0->m_notRunForThisContext = false;
            (local_2d0->m_reason)._M_dataplus._M_p = (pointer)&(local_2d0->m_reason).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d0->m_reason,local_328._0_8_,
                       (char *)(local_328._0_8_ + local_328._8_8_));
LAB_00bda0ff:
            if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
              operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
            }
            (*pLVar15->_vptr_LayoutBindingProgram[1])(pLVar15);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
            goto LAB_00bd8b9d;
          }
          (*pLVar15->_vptr_LayoutBindingProgram[1])(pLVar15);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          std::ios_base::~ios_base((ios_base *)local_168);
          pLVar11 = local_2d0;
          uVar22 = (ulong)local_2d8 & 1;
          local_2d8 = (LayoutBindingProgram *)((ulong)local_2d8 & 0xffffffff00000000);
          if (uVar22 == 0) {
            pp_Var5 = (_func_int **)(local_1d8 + 0x10);
            local_1d8._8_8_ = 0;
            local_1d8[0x10] = 0;
            local_2d0->m_passed = true;
            local_2d0->m_notRunForThisContext = false;
            (local_2d0->m_reason)._M_dataplus._M_p = (pointer)&(local_2d0->m_reason).field_2;
            local_1d8._0_8_ = pp_Var5;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d0->m_reason,pp_Var5,pp_Var5);
            if ((_func_int **)local_1d8._0_8_ == pp_Var5) {
              return pLVar11;
            }
            operator_delete((void *)local_1d8._0_8_,CONCAT71(local_1d8._17_7_,local_1d8[0x10]) + 1);
            return pLVar11;
          }
        } while( true );
      }
      local_328._0_8_ = pcVar23;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"should not compile","");
      __return_storage_ptr__ = local_2d0;
      local_2d0->m_passed = false;
      local_2d0->m_notRunForThisContext = false;
      (local_2d0->m_reason)._M_dataplus._M_p = (pointer)&(local_2d0->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0->m_reason,local_328._0_8_,
                 (char *)(local_328._0_8_ + local_328._8_8_));
      if ((char *)local_328._0_8_ != pcVar23) {
        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
      }
      (**(code **)(*plVar17 + 8))(plVar17);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      goto LAB_00bd8b9d;
    }
    if (((*pSVar6->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bd94bb;
LAB_00bd9465:
    if ((pSVar6->m_program).m_info.linkOk != true) goto LAB_00bd94bb;
    local_328._0_8_ = pcVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"should not compile","");
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,local_328._0_8_,
               (char *)(local_328._0_8_ + local_328._8_8_));
    if ((char *)local_328._0_8_ != pcVar23) goto LAB_00bd8b6f;
  }
  else {
    if (((*pSVar6->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bd845b;
LAB_00bd8b37:
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_328,pLVar15,false);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,local_328._0_8_,
               (char *)(local_328._0_8_ + local_328._8_8_));
    if ((char *)local_328._0_8_ != pcVar23) {
LAB_00bd8b6f:
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
  }
  (*pLVar15->_vptr_LayoutBindingProgram[1])(pLVar15);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
LAB_00bd8b9d:
  std::ios_base::~ios_base((ios_base *)local_168);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_examples_one_binding(void)
	{
		// example 1 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=4) uniform atomic_uint;\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());

			StringIntMap offsets = program->getOffsets(list);
			passed &= (4 == offsets[list[0]]);
			if (!passed)
			{
				return LayoutBindingTestResult(
					passed, generateLog(String("offset did not match requested"), offsets[list[0]], 1));
			}
		}

		// example 2 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(3)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName(3) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());
			list.push_back(getDefaultUniformName(1));
			list.push_back(getDefaultUniformName(2));
			list.push_back(getDefaultUniformName(3));

			StringIntMap offsets = program->getOffsets(list);
			IntVector	expected;
			expected.insert(expected.end(), 4);
			expected.insert(expected.end(), 8);
			expected.insert(expected.end(), 12);
			expected.insert(expected.end(), 16);
			for (unsigned int idx = 0; idx < list.size(); idx++)
			{
				passed &= (expected[idx] == offsets[list[idx]]);
				if (!passed)
				{
					return LayoutBindingTestResult(
						passed, generateLog(String("offset of") + String(list[idx]) + String("did not match requested"),
											offsets[list[idx]], expected[idx]));
				}
			}
		}

		// example 3 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=4) uniform atomic_uint;\n";
			s << "layout(offset=8) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 4 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 5 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		for (int pass = 0; pass < 2; pass++)
		{
			bool passed = true;

			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			if (pass)
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			if (pass)
				s << "layout(binding=0, offset=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (pass != 0)
			{
				if (passed)
				{
					return LayoutBindingTestResult(passed, program->getErrorLog());
				}
			}
			else
			{
				if (!passed)
				{
					return LayoutBindingTestResult(passed, String("should not compile"));
				}
			}
		}

		// example 6 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		for (int pass = 0; pass < 2; pass++)
		{
			bool passed = true;

			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			if (pass)
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			if (pass)
				s << "layout(binding=0, offset=2) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (pass != 0)
			{
				if (passed)
				{
					return LayoutBindingTestResult(passed, program->getErrorLog());
				}
			}
			else
			{
				if (!passed)
				{
					return LayoutBindingTestResult(passed, String("should not compile"));
				}
			}
		}

		return true;
	}